

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeSets.cpp
# Opt level: O3

void Lodtalk::dumpSistaBytecode(uint8_t *buffer,size_t size)

{
  byte bVar1;
  long lVar2;
  string *psVar3;
  ulong uVar4;
  
  if (size != 0) {
    uVar4 = 0;
    do {
      bVar1 = buffer[uVar4];
      psVar3 = getSistaBytecodeName_abi_cxx11_((uint)bVar1);
      printf("%s",(psVar3->_M_dataplus)._M_p);
      if (bVar1 < 0xe0) {
        uVar4 = uVar4 + 1;
      }
      else {
        printf(" %d",(ulong)buffer[uVar4 + 1]);
        if (bVar1 < 0xf8) {
          uVar4 = uVar4 + 2;
        }
        else {
          lVar2 = uVar4 + 2;
          uVar4 = uVar4 + 3;
          printf(" %d",(ulong)buffer[lVar2]);
        }
      }
      putchar(10);
    } while (uVar4 < size);
  }
  return;
}

Assistant:

void dumpSistaBytecode(uint8_t *buffer, size_t size)
{
    size_t pos = 0;
    while(pos < size)
    {
        auto opcode = buffer[pos++];
        auto instructionSize = getSistaBytecodeSize(opcode);
        printf("%s", getSistaBytecodeName(opcode).c_str());
        if(instructionSize > 1)
            printf(" %d", buffer[pos++]);
        if(instructionSize > 2)
            printf(" %d", buffer[pos++]);
        printf("\n");
    }
}